

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<false,_false,_false>::move_
          (DaTrie<false,_false,_false> *this,uint32_t node_pos,uint32_t base,Edge *edge,Query *query
          )

{
  pointer pBVar1;
  Bc BVar2;
  size_t sVar3;
  Bc BVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint node_pos_00;
  uint node_pos_01;
  size_t sVar7;
  ulong uVar8;
  Edge src_edge;
  Edge local_138;
  
  uVar5 = (ulong)node_pos;
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pBVar1 >> 3) <= uVar5) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x2db,
                  "void ddd::DaTrie<false, false, false>::move_(uint32_t, uint32_t, const Edge &, Query &) [WithBLM = false, WithNLM = false, Prefix = false]"
                 );
  }
  BVar2 = pBVar1[uVar5];
  if ((long)BVar2 < 0) {
    sVar3 = edge->size_;
    if (sVar3 != 0) {
      puVar6 = edge->labels_;
      for (; edge != (Edge *)(puVar6 + sVar3); edge = (Edge *)(edge->labels_ + 1)) {
        node_pos_01 = BVar2._0_4_ & 0x7fffffff ^ (uint)edge->labels_[0];
        node_pos_00 = edge->labels_[0] ^ base;
        fix_(this,node_pos_00,&this->blocks_);
        pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar1[node_pos_00] = pBVar1[node_pos_01];
        memset(&local_138,0,0x108);
        edge_(this,node_pos_01,&local_138,0x100);
        BVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                super__Vector_impl_data._M_start[node_pos_01];
        for (sVar7 = 0; local_138.size_ != sVar7; sVar7 = sVar7 + 1) {
          uVar8 = (ulong)local_138.labels_[sVar7] ^ (ulong)(BVar4._0_4_ & 0x7fffffff);
          pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar1[uVar8] =
               (Bc)((ulong)pBVar1[uVar8] & 0x80000000ffffffff |
                   (ulong)(node_pos_00 & 0x7fffffff) << 0x20);
        }
        unfix_(this,node_pos_01,&this->blocks_);
        if (node_pos_01 == query->node_pos_) {
          query->node_pos_ = node_pos_00;
        }
      }
      *(uint32_t *)
       ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
        super__Vector_impl_data._M_start + uVar5) = base & 0x7fffffff;
      return;
    }
    __assert_fail("0 < edge.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x2dd,
                  "void ddd::DaTrie<false, false, false>::move_(uint32_t, uint32_t, const Edge &, Query &) [WithBLM = false, WithNLM = false, Prefix = false]"
                 );
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x2dc,
                "void ddd::DaTrie<false, false, false>::move_(uint32_t, uint32_t, const Edge &, Query &) [WithBLM = false, WithNLM = false, Prefix = false]"
               );
}

Assistant:

void move_(uint32_t node_pos, uint32_t base, const Edge& edge, Query& query) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(0 < edge.size());

    auto orig_base = bc_[node_pos].base();

    for (auto label : edge) {
      auto src_node_pos = orig_base ^label;
      auto dst_node_pos = base ^label;

      fix_(dst_node_pos, blocks_);
      bc_[dst_node_pos] = bc_[src_node_pos];
      if (WithNLM) {
        node_links_[dst_node_pos] = node_links_[src_node_pos];
      }

      Edge src_edge;
      edge_(src_node_pos, src_edge);

      auto src_base = bc_[src_node_pos].base();
      for (auto src_label : src_edge) {
        auto src_child_pos = src_base ^src_label;
        bc_[src_child_pos].set_check(dst_node_pos);
      }

      unfix_(src_node_pos, blocks_);

      if (src_node_pos == query.node_pos()) {
        query.set_node_pos(dst_node_pos);
      }
    }

    bc_[node_pos].set_base(base);
  }